

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeEmpty(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp)

{
  uint *puVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  int *piVar4;
  SPxOut *pSVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  EmptyConstraintPS *pEVar10;
  pointer pnVar11;
  FixVariablePS *this_00;
  int iVar12;
  int32_t iVar13;
  ulong uVar14;
  cpp_dec_float<50U,_int,_void> *this_01;
  fpclass_type fVar15;
  long in_FS_OFFSET;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr2;
  undefined1 local_468 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_460;
  uint local_458 [3];
  undefined3 uStack_44b;
  uint local_448;
  undefined3 uStack_443;
  int local_440;
  bool local_43c;
  undefined8 local_438;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_428;
  int local_41c;
  uint local_418 [6];
  undefined5 uStack_400;
  undefined3 uStack_3fb;
  undefined5 local_3f8;
  undefined3 uStack_3f3;
  int local_3f0;
  undefined1 local_3ec;
  undefined8 local_3e8;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_3d8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3d0;
  shared_ptr<soplex::Tolerances> local_3c8;
  value_type local_3b8;
  shared_ptr<soplex::Tolerances> local_3a8;
  shared_ptr<soplex::Tolerances> local_398;
  double local_388;
  undefined8 uStack_380;
  undefined4 local_378;
  uint uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  element_type *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  uint local_358 [2];
  undefined8 uStack_350;
  undefined8 local_348;
  element_type *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  uint local_328 [2];
  undefined8 uStack_320;
  undefined8 local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined5 uStack_170;
  undefined3 uStack_16b;
  undefined5 uStack_168;
  undefined8 uStack_163;
  undefined8 local_158;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  lVar9 = (long)(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
  iVar8 = 0;
  local_3d0 = this;
  if (0 < lVar9) {
    local_428 = &this->m_hist;
    uVar14 = lVar9 + 1;
    lVar9 = lVar9 * 0x1c + -4;
    iVar8 = 0;
    do {
      if ((lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[uVar14 - 2].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 0) {
        pnVar11 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_248.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x10);
        puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x30);
        local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_248.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x20);
        local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_248.m_backend.exp =
             *(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -8);
        local_248.m_backend.neg =
             *(bool *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -4);
        local_248.m_backend._48_8_ =
             *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2);
        local_1c8.m_backend.fpclass = cpp_dec_float_finite;
        local_1c8.m_backend.prec_elem = 10;
        local_1c8.m_backend.data._M_elems[0] = 0;
        local_1c8.m_backend.data._M_elems[1] = 0;
        local_1c8.m_backend.data._M_elems[2] = 0;
        local_1c8.m_backend.data._M_elems[3] = 0;
        local_1c8.m_backend.data._M_elems[4] = 0;
        local_1c8.m_backend.data._M_elems[5] = 0;
        local_1c8.m_backend.data._M_elems._24_5_ = 0;
        local_1c8.m_backend.data._M_elems[7]._1_3_ = 0;
        local_1c8.m_backend.data._M_elems._32_5_ = 0;
        local_1c8.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1c8,0.0);
        feastol(&local_68,this);
        bVar7 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_248,&local_1c8,&local_68);
        if (bVar7) {
          return INFEASIBLE;
        }
        pnVar11 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_318 = *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x10);
        puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x30);
        local_338 = *(element_type **)puVar1;
        p_Stack_330 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2);
        puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -0x20);
        local_328 = *(uint (*) [2])puVar1;
        uStack_320 = *(undefined8 *)(puVar1 + 2);
        local_3d8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(local_3d8._4_4_,
                                *(undefined4 *)
                                 ((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -8));
        uVar2 = *(undefined1 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2 + -4);
        uVar3 = *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 * 2);
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems._24_5_ = 0;
        local_148.data._M_elems[7]._1_3_ = 0;
        local_148.data._M_elems._32_5_ = 0;
        local_148._37_8_ = 0;
        local_41c = iVar8;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_148,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_d8,this);
        _local_448 = (undefined5)local_318;
        uStack_443 = (undefined3)((ulong)local_318 >> 0x28);
        local_458[0] = local_328[0];
        local_458[1] = local_328[1];
        stack0xfffffffffffffbb0 = (undefined5)uStack_320;
        uStack_44b = (undefined3)((ulong)uStack_320 >> 0x28);
        local_468 = (undefined1  [8])local_338;
        _Stack_460._M_pi = p_Stack_330;
        local_440 = (int)local_3d8;
        local_43c = (bool)uVar2;
        local_438 = uVar3;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_468,&local_148);
        if ((((fpclass_type)local_438 != cpp_dec_float_NaN) &&
            (local_d8.fpclass != cpp_dec_float_NaN)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_468,&local_d8), 0 < iVar8)) {
          return INFEASIBLE;
        }
        pEVar10 = (EmptyConstraintPS *)operator_new(0x68);
        this = local_3d0;
        local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_3d0->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_3d0->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        EmptyConstraintPS::EmptyConstraintPS(pEVar10,lp,(int)(uVar14 - 2),&local_398);
        local_468 = (undefined1  [8])pEVar10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::EmptyConstraintPS*>
                  (&_Stack_460,pEVar10);
        if (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_398.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_428->data,(value_type *)local_468);
        iVar8 = local_41c;
        piVar4 = (this->m_rIdx).data;
        piVar4[uVar14 - 2] =
             piVar4[(long)(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0xf])(lp,uVar14 - 2 & 0xffffffff);
        piVar4 = (this->m_stat).data;
        *piVar4 = *piVar4 + 1;
        if (_Stack_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_460._M_pi);
        }
        iVar8 = iVar8 + 1;
      }
      uVar14 = uVar14 - 1;
      lVar9 = lVar9 + -0x1c;
    } while (1 < uVar14);
  }
  uVar14 = (ulong)(lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
  iVar12 = 0;
  local_41c = iVar8;
  if (0 < (long)uVar14) {
    local_388 = *(double *)(in_FS_OFFSET + -8);
    local_378 = SUB84(local_388,0);
    uStack_380 = 0;
    uStack_374 = (uint)((ulong)local_388 >> 0x20) ^ 0x80000000;
    uStack_370 = 0;
    uStack_36c = 0x80000000;
    local_3d8 = &this->m_hist;
    lVar9 = uVar14 * 0x38;
    iVar12 = 0;
    do {
      if ((lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[uVar14 - 1].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 0) {
        pnVar11 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3e8._0_4_ = cpp_dec_float_finite;
        local_3e8._4_4_ = 10;
        local_418[0] = 0;
        local_418[1] = 0;
        local_418[2] = 0;
        local_418[3] = 0;
        local_418[4] = 0;
        local_418[5] = 0;
        uStack_400 = 0;
        uStack_3fb = 0;
        local_3f8 = 0;
        uStack_3f3 = 0;
        local_3f0 = 0;
        local_3ec = 0;
        puVar1 = (uint *)((long)pnVar11[-1].m_backend.data._M_elems + lVar9);
        local_368 = *(element_type **)puVar1;
        p_Stack_360 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2);
        puVar1 = (uint *)((long)(&(pnVar11->m_backend).data + -1) + lVar9);
        local_358 = *(uint (*) [2])puVar1;
        uStack_350 = *(undefined8 *)(puVar1 + 2);
        local_348 = *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x18);
        iVar8 = *(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x10);
        uVar2 = *(undefined1 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0xc);
        uVar3 = *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8);
        local_208.fpclass = cpp_dec_float_finite;
        local_208.prec_elem = 10;
        local_208.data._M_elems[0] = 0;
        local_208.data._M_elems[1] = 0;
        local_208.data._M_elems[2] = 0;
        local_208.data._M_elems[3] = 0;
        local_208.data._M_elems[4] = 0;
        local_208.data._M_elems[5] = 0;
        local_208.data._M_elems._24_5_ = 0;
        local_208.data._M_elems[7]._1_3_ = 0;
        local_208.data._M_elems._32_5_ = 0;
        local_208._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_110,this);
        _local_448 = (undefined5)local_348;
        uStack_443 = (undefined3)((ulong)local_348 >> 0x28);
        local_458[0] = local_358[0];
        local_458[1] = local_358[1];
        stack0xfffffffffffffbb0 = (undefined5)uStack_350;
        uStack_44b = (undefined3)((ulong)uStack_350 >> 0x28);
        local_468 = (undefined1  [8])local_368;
        _Stack_460._M_pi = p_Stack_360;
        local_440 = iVar8;
        local_43c = (bool)uVar2;
        local_438 = uVar3;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_468,&local_208);
        if ((((fpclass_type)local_438 == cpp_dec_float_NaN) ||
            (local_110.fpclass == cpp_dec_float_NaN)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_468,&local_110), iVar8 < 1)) {
          pnVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_288.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x18);
          puVar1 = (uint *)((long)pnVar11[-1].m_backend.data._M_elems + lVar9);
          local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_288.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(&(pnVar11->m_backend).data + -1) + lVar9);
          local_288.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_288.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_288.m_backend.exp =
               *(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x10);
          local_288.m_backend.neg =
               *(bool *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0xc);
          local_288.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8);
          local_158 = 0xa00000000;
          local_188 = 0;
          uStack_180 = 0;
          local_178 = 0;
          uStack_170 = 0;
          uStack_16b = 0;
          uStack_168 = 0;
          uStack_163 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_188,0.0);
          epsZero(&local_a0,local_3d0);
          bVar7 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_288,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_188,&local_a0);
          pnVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          this_01 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)pnVar11[-1].m_backend.data._M_elems + lVar9);
          if (bVar7) {
            ::soplex::infinity::__tls_init();
            local_438._0_4_ = cpp_dec_float_finite;
            local_438._4_4_ = 10;
            local_468 = (undefined1  [8])0x0;
            _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_458[0] = 0;
            local_458[1] = 0;
            stack0xfffffffffffffbb0 = 0;
            uStack_44b = 0;
            _local_448 = 0;
            uStack_443 = 0;
            local_440 = 0;
            local_43c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_468,
                       (double)CONCAT44(uStack_374,local_378));
            if (((*(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8) != 2) &&
                ((fpclass_type)local_438 != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (this_01,(cpp_dec_float<50U,_int,_void> *)local_468), iVar8 < 1))
            {
              return UNBOUNDED;
            }
LAB_00309179:
            pnVar11 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00309180;
          }
          ::soplex::infinity::__tls_init();
          local_438._0_4_ = cpp_dec_float_finite;
          local_438._4_4_ = 10;
          local_468 = (undefined1  [8])0x0;
          _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_458[0] = 0;
          local_458[1] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          _local_448 = 0;
          uStack_443 = 0;
          local_440 = 0;
          local_43c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_468,(double)CONCAT44(uStack_374,local_378)
                    );
          if (((*(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8) != 2) &&
              ((fpclass_type)local_438 != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (this_01,(cpp_dec_float<50U,_int,_void> *)local_468), 0 < iVar8))
          goto LAB_00309179;
          pnVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_438._0_4_ = cpp_dec_float_finite;
          local_438._4_4_ = 10;
          local_468 = (undefined1  [8])0x0;
          _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_458[0] = 0;
          local_458[1] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          _local_448 = 0;
          uStack_443 = 0;
          local_440 = 0;
          local_43c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_468,local_388);
          if (((*(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8) != 2) &&
              ((fpclass_type)local_438 != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)pnVar11[-1].m_backend.data._M_elems + lVar9),
                                 (cpp_dec_float<50U,_int,_void> *)local_468), iVar8 < 0)) {
            pnVar11 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00309180;
          }
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_418,0.0);
          local_428 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)CONCAT44(local_428._4_4_,local_3f0);
          fVar15 = (fpclass_type)local_3e8;
          iVar13 = local_3e8._4_4_;
        }
        else {
          pnVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_438._0_4_ = cpp_dec_float_finite;
          local_438._4_4_ = 10;
          local_468 = (undefined1  [8])0x0;
          _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_458[0] = 0;
          local_458[1] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          _local_448 = 0;
          uStack_443 = 0;
          local_440 = 0;
          local_43c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_468,local_388);
          if (((*(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8) != 2) &&
              ((fpclass_type)local_438 != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)pnVar11[-1].m_backend.data._M_elems + lVar9),
                                 (cpp_dec_float<50U,_int,_void> *)local_468), -1 < iVar8)) {
            return UNBOUNDED;
          }
          pnVar11 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00309180:
          uVar3 = *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x18);
          local_3f8 = (undefined5)uVar3;
          uStack_3f3 = (undefined3)((ulong)uVar3 >> 0x28);
          puVar1 = (uint *)((long)pnVar11[-1].m_backend.data._M_elems + lVar9);
          local_418._0_8_ = *(undefined8 *)puVar1;
          local_418._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(&(pnVar11->m_backend).data + -1) + lVar9);
          local_418._16_8_ = *(undefined8 *)puVar1;
          uVar3 = *(undefined8 *)(puVar1 + 2);
          uStack_400 = (undefined5)uVar3;
          uStack_3fb = (undefined3)((ulong)uVar3 >> 0x28);
          local_3f0 = *(int *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0x10);
          local_428 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)CONCAT44(local_428._4_4_,local_3f0);
          local_3ec = *(undefined1 *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -0xc);
          local_3e8._0_4_ = *(fpclass_type *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -8)
          ;
          local_3e8._4_4_ = *(int32_t *)((long)(pnVar11->m_backend).data._M_elems + lVar9 + -4);
          fVar15 = (fpclass_type)local_3e8;
          iVar13 = local_3e8._4_4_;
        }
        uVar2 = local_3ec;
        pEVar10 = (EmptyConstraintPS *)operator_new(0x30);
        this = local_3d0;
        local_308.m_backend.data._M_elems[7]._1_3_ = uStack_3fb;
        local_308.m_backend.data._M_elems._24_5_ = uStack_400;
        local_308.m_backend.data._M_elems[0] = local_418[0];
        local_308.m_backend.data._M_elems[1] = local_418[1];
        local_308.m_backend.data._M_elems[2] = local_418[2];
        local_308.m_backend.data._M_elems[3] = local_418[3];
        local_308.m_backend.data._M_elems[4] = local_418[4];
        local_308.m_backend.data._M_elems[5] = local_418[5];
        local_308.m_backend.data._M_elems[9]._1_3_ = uStack_3f3;
        local_308.m_backend.data._M_elems._32_5_ = local_3f8;
        local_308.m_backend.exp = (int)local_428;
        local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_3d0->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_3d0->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        iVar8 = (int)(uVar14 - 1);
        local_308.m_backend.neg = (bool)uVar2;
        local_308.m_backend.fpclass = fVar15;
        local_308.m_backend.prec_elem = iVar13;
        FixBoundsPS::FixBoundsPS((FixBoundsPS *)pEVar10,lp,iVar8,&local_308,&local_3a8);
        local_468 = (undefined1  [8])pEVar10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                  (&_Stack_460,(FixBoundsPS *)pEVar10);
        if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_00 = (FixVariablePS *)operator_new(0x138);
        local_2c8.m_backend.data._M_elems[9]._1_3_ = uStack_3f3;
        local_2c8.m_backend.data._M_elems._32_5_ = local_3f8;
        local_2c8.m_backend.data._M_elems[7]._1_3_ = uStack_3fb;
        local_2c8.m_backend.data._M_elems._24_5_ = uStack_400;
        local_2c8.m_backend.data._M_elems[4] = local_418[4];
        local_2c8.m_backend.data._M_elems[5] = local_418[5];
        local_2c8.m_backend.data._M_elems[0] = local_418[0];
        local_2c8.m_backend.data._M_elems[1] = local_418[1];
        local_2c8.m_backend.data._M_elems[2] = local_418[2];
        local_2c8.m_backend.data._M_elems[3] = local_418[3];
        local_2c8.m_backend.exp = local_3f0;
        local_2c8.m_backend.neg = (bool)local_3ec;
        local_2c8.m_backend.fpclass = (fpclass_type)local_3e8;
        local_2c8.m_backend.prec_elem = local_3e8._4_4_;
        local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FixVariablePS::FixVariablePS(this_00,lp,this,iVar8,&local_2c8,&local_3c8,true);
        local_3b8.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
                  (&local_3b8.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_00);
        if (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_3d8->data,(value_type *)local_468);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_3d8->data,&local_3b8);
        piVar4 = (this->m_cIdx).data;
        piVar4[uVar14 - 1] =
             piVar4[(long)(lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x15])(lp,uVar14 - 1 & 0xffffffff);
        piVar4 = (this->m_stat).data + 4;
        *piVar4 = *piVar4 + 1;
        if (local_3b8.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3b8.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (_Stack_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_460._M_pi);
        }
        iVar12 = iVar12 + 1;
      }
      lVar9 = lVar9 + -0x38;
      bVar7 = 1 < uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar7);
  }
  iVar8 = local_41c;
  if (iVar12 + local_41c != 0 && SCARRY4(iVar12,local_41c) == iVar12 + local_41c < 0) {
    piVar4 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_remRows;
    *piVar4 = *piVar4 + local_41c;
    piVar4 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_remCols;
    *piVar4 = *piVar4 + iVar12;
    pSVar5 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if (pSVar5 != (SPxOut *)0x0) {
      if (3 < (int)pSVar5->m_verbosity) {
        local_468._0_4_ = pSVar5->m_verbosity;
        local_418[0] = 4;
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity],"Simplifier (empty rows/colums) removed ",
                   0x27);
        std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity]," cols",5);
        cVar6 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pSVar5 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_468);
        return OKAY;
      }
      return OKAY;
    }
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}